

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_InvertUniformSphere_Test::TestBody(Sampling_InvertUniformSphere_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3f VVar8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Point2f up;
  Vector3f v;
  Point2f u;
  Uniform2DIter __end1;
  Uniform2DIter __begin1;
  Uniform2D *__range1;
  Uniform2DIter *in_stack_fffffffffffffe78;
  IndexingIterator<pbrt::detail::Uniform2DIter> *in_stack_fffffffffffffe80;
  Uniform2DIter *in_stack_fffffffffffffe88;
  Uniform2D *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffe98;
  Message *in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffea8;
  AssertionResult *in_stack_fffffffffffffeb0;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff30;
  float *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  AssertionResult local_98;
  undefined8 local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  IndexingIterator<pbrt::detail::Uniform2DIter> local_40 [3];
  undefined1 local_28 [24];
  undefined1 *local_10;
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  undefined1 extraout_var_00 [56];
  
  pbrt::Uniform2D::RNGGenerator
            (in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (uint64_t)in_stack_fffffffffffffe80,(uint64_t)in_stack_fffffffffffffe78);
  local_10 = local_28;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::begin
            ((IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)
             in_stack_fffffffffffffe80);
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::end
            ((IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)
             in_stack_fffffffffffffe80);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform2DIter>::operator!=
                           (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78), bVar1) {
    auVar4._0_8_ = pbrt::detail::Uniform2DIter::operator*(in_stack_fffffffffffffe88);
    auVar4._8_56_ = extraout_var;
    local_60 = vmovlpd_avx(auVar4._0_16_);
    auVar7 = extraout_var;
    VVar8 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffea0);
    local_78 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    local_80 = vmovlpd_avx(auVar5._0_16_);
    iVar3 = (int)&local_70;
    local_70 = local_80;
    local_68 = local_78;
    auVar6._0_8_ = pbrt::InvertUniformSphereSample((Vector3f *)in_stack_fffffffffffffe78);
    auVar6._8_56_ = extraout_var_00;
    local_88 = vmovlpd_avx(auVar6._0_16_);
    std::abs(iVar3);
    this_00 = &local_98;
    testing::internal::CmpHelperLT<float,double>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (double *)in_stack_ffffffffffffff30.ptr_);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(char (*) [3])in_stack_fffffffffffffe78);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(Point2<float> *)in_stack_fffffffffffffe78);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(char (*) [5])in_stack_fffffffffffffe78);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(Vector3<float> *)in_stack_fffffffffffffe78);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(char (*) [5])in_stack_fffffffffffffe78);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffe80,(Point2<float> *)in_stack_fffffffffffffe78);
      testing::AssertionResult::failure_message((AssertionResult *)0x62cffc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),(char *)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(char *)in_stack_fffffffffffffe90);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff00),(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
      testing::Message::~Message((Message *)0x62d056);
    }
    iVar3 = (int)&local_98;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x62d0ae);
    std::abs(iVar3);
    in_stack_fffffffffffffeb0 = (AssertionResult *)&stack0xffffffffffffff28;
    testing::internal::CmpHelperLT<float,double>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (double *)in_stack_ffffffffffffff30.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffeb0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffea8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,(char (*) [3])in_stack_fffffffffffffe78);
      in_stack_fffffffffffffea0 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,
                      (Point2<float> *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe98 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,(char (*) [5])in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe90 =
           (Uniform2D *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,
                      (Vector3<float> *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe88 =
           (Uniform2DIter *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,(char (*) [5])in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe80 =
           (IndexingIterator<pbrt::detail::Uniform2DIter> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffe80,
                      (Point2<float> *)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe78 =
           (Uniform2DIter *)testing::AssertionResult::failure_message((AssertionResult *)0x62d210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffeb0,
                 (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20),(char *)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(char *)in_stack_fffffffffffffe90);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff00),(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe80);
      testing::Message::~Message((Message *)0x62d268);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x62d2bd);
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform2DIter>::operator++(local_40);
  }
  return;
}

Assistant:

TEST(Sampling, InvertUniformSphere) {
    for (Point2f u : Uniform2D(1000)) {
        Vector3f v = SampleUniformSphere(u);
        Point2f up = InvertUniformSphereSample(v);

        EXPECT_LT(std::abs(u.x - up.x), 1e-3) << "u " << u << " -> " << v << " -> " << up;
        EXPECT_LT(std::abs(u.y - up.y), 1e-3) << "u " << u << " -> " << v << " -> " << up;
    }
}